

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

string * __thiscall
glcts::generateBasicFragmentSrc_abi_cxx11_
          (string *__return_storage_ptr__,glcts *this,GLSLVersion glslVersion)

{
  char *pcVar1;
  ostream *poVar2;
  stringstream local_1a0 [8];
  stringstream str;
  ostream local_190;
  GLSLVersion local_14;
  string *psStack_10;
  GLSLVersion glslVersion_local;
  
  local_14 = (GLSLVersion)this;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  pcVar1 = glu::getGLSLVersionDeclaration(local_14);
  poVar2 = std::operator<<(&local_190,pcVar1);
  std::operator<<(poVar2,"\n");
  std::operator<<(&local_190,
                  "uniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n   o_color = u_color;\n}\n"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateBasicFragmentSrc(glu::GLSLVersion glslVersion)
{
	std::stringstream str;

	str << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
	str << "uniform highp vec4 u_color;\n"
		   "layout(location = 0) out mediump vec4 o_color;\n"
		   "void main (void)\n"
		   "{\n"
		   "   o_color = u_color;\n"
		   "}\n";

	return str.str();
}